

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O0

void summary(reg_object obj)

{
  uint local_14;
  int i;
  reg_object obj_local;
  
  printf("\n");
  printf("%-25s \n","Regression Summary");
  printf("%-25s%-20s%-20s \n","Coefficients","Value","Standard Error");
  for (local_14 = 0; (int)local_14 < obj->p; local_14 = local_14 + 1) {
    printf("B%-25d%-20lf%-20g \n",obj->beta[(int)local_14].value,obj->beta[(int)local_14].stdErr,
           (ulong)local_14);
  }
  printf("\n");
  printf("Residual Variance = %lf \n",obj->sigma);
  printf("R-Squared = %lf , Adjusted R-Squared = %lf \n",obj->R2[0],obj->R2[1]);
  return;
}

Assistant:

void summary(reg_object obj) {
	int i;
	printf("\n");
	printf("%-25s \n", "Regression Summary");
	printf("%-25s%-20s%-20s \n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->p; ++i) {
		printf("B%-25d%-20lf%-20g \n", i, (obj->beta + i)->value, (obj->beta + i)->stdErr);
	}
	printf("\n");
	printf("Residual Variance = %lf \n", obj->sigma);
	printf("R-Squared = %lf , Adjusted R-Squared = %lf \n", obj->R2[0], obj->R2[1]);

}